

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

bool __thiscall summarycalc::loadcoverages(summarycalc *this)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  char *__filename;
  undefined8 uVar3;
  size_t sVar4;
  reference pvVar5;
  int local_a8;
  int local_a4;
  int i;
  int coverage_id;
  uint nrec;
  OASIS_FLOAT tiv;
  longlong sz;
  FILE *fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [55];
  allocator local_31;
  string local_30 [8];
  string file;
  summarycalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"input/coverages.bin",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::substr((ulong)&fin,(ulong)local_30);
    std::operator+(local_68,&this->inputpath_);
    std::__cxx11::string::operator=(local_30,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&fin);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  sz = (longlong)fopen(__filename,"rb");
  __stream = _stderr;
  if ((FILE *)sz == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"FATAL: %s Error opening file %s\n","loadcoverages",uVar3);
    exit(-1);
  }
  fseek((FILE *)sz,0,2);
  _nrec = ftell((FILE *)sz);
  fseek((FILE *)sz,0,0);
  std::vector<float,_std::allocator<float>_>::resize(&this->coverages_,(ulong)((nrec >> 2) + 1));
  local_a4 = 0;
  sVar4 = fread(&coverage_id,4,1,(FILE *)sz);
  local_a8 = (int)sVar4;
  while (iVar1 = coverage_id, local_a8 != 0) {
    local_a4 = local_a4 + 1;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->coverages_,(long)local_a4);
    *pvVar5 = (value_type)iVar1;
    sVar4 = fread(&coverage_id,4,1,(FILE *)sz);
    local_a8 = (int)sVar4;
  }
  fclose((FILE *)sz);
  std::__cxx11::string::~string(local_30);
  return true;
}

Assistant:

bool summarycalc::loadcoverages()
{
	std::string file = COVERAGES_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s Error opening file %s\n", __func__, file.c_str());
		exit(-1);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	unsigned int nrec = (unsigned int)sz / (unsigned int) sizeof(tiv);

	coverages_.resize(nrec + 1);
	int coverage_id = 0;
	int i = (int) fread(&tiv,sizeof(tiv),1, fin);
	while (i != 0) {
		coverage_id++;
		coverages_[coverage_id] = tiv;
		i = (int)fread(&tiv, sizeof(tiv),
			1, fin);
	}

	fclose(fin);
	return true;

}